

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedRun.cpp
# Opt level: O3

SortedRun *
SortedRun::pick_common
          (SortedRun *__return_storage_ptr__,int cutoff,
          vector<SortedRun_*,_std::allocator<SortedRun_*>_> *sources)

{
  uint uVar1;
  pointer ppSVar2;
  SortedRun *pSVar3;
  pointer puVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *p_Var5;
  pointer ppVar6;
  pointer ppVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  pointer ppVar11;
  int i;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  pointer ppVar15;
  uint *puVar16;
  ulong uVar17;
  pointer ppSVar18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  heads;
  FileId min_id;
  pointer local_88;
  iterator iStack_80;
  pointer local_78;
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  local_68;
  pair<__gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  SortedRun *local_38;
  
  local_78 = (pointer)0x0;
  local_88 = (pointer)0x0;
  iStack_80._M_current = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38 = __return_storage_ptr__;
  std::
  vector<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
  ::reserve(&local_68,
            (long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 3);
  ppSVar18 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppSVar2 = (sources->super__Vector_base<SortedRun_*,_std::allocator<SortedRun_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar18 != ppSVar2) {
    do {
      pSVar3 = *ppSVar18;
      decompress(pSVar3);
      if (((pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start !=
           (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish) ||
         ((pSVar3->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          (pSVar3->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish)) {
        validate_compression(pSVar3,false);
        puVar4 = (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        validate_compression(pSVar3,false);
        local_48.second._M_current =
             (pSVar3->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        local_48.first._M_current = puVar4;
        std::
        vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
        ::
        emplace_back<std::pair<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>
                  ((vector<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::allocator<std::pair<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                    *)&local_68,&local_48);
      }
      ppSVar18 = ppSVar18 + 1;
    } while (ppSVar18 != ppSVar2);
  }
  uVar13 = (ulong)((long)local_68.
                         super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_68.
                        super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 4;
  ppVar11 = local_68.
            super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (cutoff <= (int)uVar13) {
    ppVar6 = local_68.
             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar7 = local_68.
             super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    do {
      uVar8 = *(ppVar11->first)._M_current;
      local_48.first._M_current._0_4_ = uVar8;
      iVar9 = 0;
      if ((int)uVar13 < 2) {
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        uVar17 = 1;
        ppVar15 = ppVar11;
        do {
          ppVar15 = ppVar15 + 1;
          uVar1 = *(ppVar15->first)._M_current;
          if (uVar1 < uVar8) {
            local_48.first._M_current._0_4_ = uVar1;
            uVar14 = uVar17 & 0xffffffff;
            uVar8 = uVar1;
          }
          uVar17 = uVar17 + 1;
        } while ((uVar13 & 0xffffffff) != uVar17);
      }
      if ((int)uVar14 < (int)((ulong)((long)ppVar7 - (long)ppVar11) >> 4)) {
        iVar9 = 0;
        do {
          iVar12 = (int)uVar14;
          puVar16 = ppVar11[iVar12].first._M_current;
          if (*puVar16 == uVar8) {
            ppVar15 = ppVar11 + iVar12;
            iVar9 = iVar9 + 1;
            puVar16 = puVar16 + 1;
            (ppVar15->first)._M_current = puVar16;
            ppVar11 = ppVar6;
            if (puVar16 == (ppVar15->second)._M_current) {
              if ((ppVar6 + (long)iVar12 + 1 != ppVar7) &&
                 (lVar10 = (long)ppVar7 - (long)(ppVar6 + (long)iVar12 + 1) >> 4, 0 < lVar10)) {
                uVar13 = lVar10 + 1;
                p_Var5 = &ppVar6[(long)iVar12 + 1].second;
                do {
                  p_Var5[-3] = (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                )(((pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                    *)(p_Var5 + -1))->first)._M_current;
                  p_Var5[-2] = (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                )p_Var5->_M_current;
                  uVar13 = uVar13 - 1;
                  p_Var5 = p_Var5 + 2;
                  ppVar6 = local_68.
                           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar7 = local_68.
                           super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                } while (1 < uVar13);
              }
              ppVar7 = ppVar7 + -1;
              iVar12 = iVar12 + -1;
              ppVar11 = ppVar6;
              local_68.
              super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
            }
          }
          uVar14 = (ulong)(iVar12 + 1U);
        } while ((int)(iVar12 + 1U) < (int)((ulong)((long)ppVar7 - (long)ppVar11) >> 4));
      }
      if (cutoff <= iVar9) {
        if (iStack_80._M_current == local_78) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_88,iStack_80,
                     (uint *)&local_48);
          ppVar6 = local_68.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          ppVar7 = local_68.
                   super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar11 = local_68.
                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *iStack_80._M_current = uVar8;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      uVar13 = (ulong)((long)ppVar7 - (long)ppVar11) >> 4;
    } while (cutoff <= (int)uVar13);
  }
  pSVar3 = local_38;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = local_88;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = iStack_80._M_current;
  (local_38->sequence_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_78;
  local_78 = (pointer)0x0;
  local_88 = (pointer)0x0;
  iStack_80._M_current = (uint *)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_38->run_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((ppVar11 != (pointer)0x0) &&
     (operator_delete(ppVar11,(long)local_68.
                                    super__Vector_base<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<__gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)ppVar11), local_88 != (pointer)0x0)) {
    operator_delete(local_88,(long)local_78 - (long)local_88);
  }
  return pSVar3;
}

Assistant:

SortedRun SortedRun::pick_common(int cutoff,
                                 std::vector<SortedRun *> &sources) {
    // returns all FileIds which appear at least `cutoff` times among provided
    // `sources`
    using FileIdRange = std::pair<std::vector<FileId>::const_iterator,
                                  std::vector<FileId>::const_iterator>;
    std::vector<FileId> result;
    std::vector<FileIdRange> heads;
    heads.reserve(sources.size());

    for (auto source : sources) {
        source->decompress();
        if (!source->empty()) {
            heads.emplace_back(std::make_pair(source->begin(), source->end()));
        }
    }

    while (static_cast<int>(heads.size()) >= cutoff) {
        // pick lowest possible FileId value among all current heads
        int min_index = 0;
        FileId min_id = *heads[0].first;
        for (int i = 1; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first < min_id) {
                min_index = i;
                min_id = *heads[i].first;
            }
        }

        // fix on that particular value selected in previous step and count
        // number of repetitions among heads.
        // Note that it's implementation-defined that std::vector<FileId>
        // is always sorted and we use this fact here.
        int repeat_count = 0;
        for (int i = min_index; i < static_cast<int>(heads.size()); i++) {
            if (*heads[i].first == min_id) {
                repeat_count += 1;
                heads[i].first++;
                // head ended, we may get rid of it
                if (heads[i].first == heads[i].second) {
                    heads.erase(heads.begin() + i);
                    i--;  // Be careful not to skip elements!
                }
            }
        }

        // this value has enough repetitions among different heads to add it to
        // the result set
        if (repeat_count >= cutoff) {
            result.push_back(min_id);
        }
    }

    return SortedRun(std::move(result));
}